

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

bool testing::internal::ParseStringFlag(char *str,char *flag,String *value)

{
  char *a_c_str;
  
  a_c_str = ParseFlagValue(str,flag,false);
  if (a_c_str != (char *)0x0) {
    String::operator=(value,a_c_str);
  }
  return a_c_str != (char *)0x0;
}

Assistant:

bool ParseStringFlag(const char* str, const char* flag, String* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  *value = value_str;
  return true;
}